

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogbox.cpp
# Opt level: O2

int __thiscall dialogbox::EndGameDialogBox(dialogbox *this,int black,int white,int turn)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[19;7Hblack:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,black);
  poVar1 = std::operator<<(poVar1," white:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,white);
  poVar1 = std::operator<<(poVar1," turn:");
  std::ostream::operator<<(poVar1,turn);
  return 1;
}

Assistant:

int dialogbox::EndGameDialogBox(int black, int white, int turn){
	std::cout<<"\e[19;7Hblack:"<<black<<" white:"<<white<<" turn:"<<turn;
	return 1;
}